

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O0

bool loadBuffers(void)

{
  bool bVar1;
  undefined1 local_9;
  bool v;
  
  local_9 = loadTransformBuffer();
  if (local_9) {
    bVar1 = loadGeometryBuffers();
    local_9 = local_9 && bVar1;
  }
  if (local_9 != false) {
    bVar1 = loadInstancedGeometryBuffers();
    local_9 = (local_9 & bVar1) != 0;
  }
  if (local_9 != false) {
    bVar1 = loadSubdivisionBuffers();
    local_9 = (local_9 & bVar1) != 0;
  }
  return local_9;
}

Assistant:

bool loadBuffers()
{
    bool v = true;

    if (v) v &= loadTransformBuffer();
    if (v) v &= loadGeometryBuffers();
    if (v) v &= loadInstancedGeometryBuffers();
    if (v) v &= loadSubdivisionBuffers();

    return v;
}